

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked.h
# Opt level: O0

back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
utf8::append<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (uint32_t cp,
          back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> result)

{
  bool bVar1;
  invalid_code_point *this;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *pbVar2;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_c8;
  byte local_b9;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_b8;
  byte local_a9;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_a8;
  byte local_99;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_98;
  byte local_89;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_88;
  byte local_79;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_78;
  byte local_69;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_68;
  byte local_59;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_58;
  byte local_49;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_48;
  byte local_39;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_38;
  value_type_conflict5 local_2d [17];
  uint local_1c;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> bStack_18;
  uint32_t cp_local;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> result_local;
  
  local_1c = cp;
  bStack_18.container = result.container;
  bVar1 = internal::is_code_point_valid<unsigned_int>(cp);
  if (bVar1) {
    if (local_1c < 0x80) {
      local_2d[0] = (value_type_conflict5)local_1c;
      local_38 = std::
                 back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
                 operator++(&stack0xffffffffffffffe8,0);
      pbVar2 = std::
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
               operator*(&local_38);
      std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      operator=(pbVar2,local_2d);
    }
    else if (local_1c < 0x800) {
      local_39 = (byte)(local_1c >> 6) | 0xc0;
      local_48 = std::
                 back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
                 operator++(&stack0xffffffffffffffe8,0);
      pbVar2 = std::
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
               operator*(&local_48);
      std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      operator=(pbVar2,&local_39);
      local_49 = (byte)local_1c & 0x3f | 0x80;
      local_58 = std::
                 back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
                 operator++(&stack0xffffffffffffffe8,0);
      pbVar2 = std::
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
               operator*(&local_58);
      std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      operator=(pbVar2,&local_49);
    }
    else if (local_1c < 0x10000) {
      local_59 = (byte)(local_1c >> 0xc) | 0xe0;
      local_68 = std::
                 back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
                 operator++(&stack0xffffffffffffffe8,0);
      pbVar2 = std::
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
               operator*(&local_68);
      std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      operator=(pbVar2,&local_59);
      local_69 = (byte)(local_1c >> 6) & 0x3f | 0x80;
      local_78 = std::
                 back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
                 operator++(&stack0xffffffffffffffe8,0);
      pbVar2 = std::
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
               operator*(&local_78);
      std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      operator=(pbVar2,&local_69);
      local_79 = (byte)local_1c & 0x3f | 0x80;
      local_88 = std::
                 back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
                 operator++(&stack0xffffffffffffffe8,0);
      pbVar2 = std::
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
               operator*(&local_88);
      std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      operator=(pbVar2,&local_79);
    }
    else {
      local_89 = (byte)(local_1c >> 0x12) | 0xf0;
      local_98 = std::
                 back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
                 operator++(&stack0xffffffffffffffe8,0);
      pbVar2 = std::
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
               operator*(&local_98);
      std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      operator=(pbVar2,&local_89);
      local_99 = (byte)(local_1c >> 0xc) & 0x3f | 0x80;
      local_a8 = std::
                 back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
                 operator++(&stack0xffffffffffffffe8,0);
      pbVar2 = std::
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
               operator*(&local_a8);
      std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      operator=(pbVar2,&local_99);
      local_a9 = (byte)(local_1c >> 6) & 0x3f | 0x80;
      local_b8 = std::
                 back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
                 operator++(&stack0xffffffffffffffe8,0);
      pbVar2 = std::
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
               operator*(&local_b8);
      std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      operator=(pbVar2,&local_a9);
      local_b9 = (byte)local_1c & 0x3f | 0x80;
      local_c8 = std::
                 back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
                 operator++(&stack0xffffffffffffffe8,0);
      pbVar2 = std::
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
               operator*(&local_c8);
      std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
      operator=(pbVar2,&local_b9);
    }
    return (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
           bStack_18.container;
  }
  this = (invalid_code_point *)__cxa_allocate_exception(0x10);
  invalid_code_point::invalid_code_point(this,local_1c);
  __cxa_throw(this,&invalid_code_point::typeinfo,invalid_code_point::~invalid_code_point);
}

Assistant:

octet_iterator append(uint32_t cp, octet_iterator result)
    {
        if (!utf8::internal::is_code_point_valid(cp))
            throw invalid_code_point(cp);

        if (cp < 0x80)                        // one octet
            *(result++) = static_cast<uint8_t>(cp);
        else if (cp < 0x800) {                // two octets
            *(result++) = static_cast<uint8_t>((cp >> 6)            | 0xc0);
            *(result++) = static_cast<uint8_t>((cp & 0x3f)          | 0x80);
        }
        else if (cp < 0x10000) {              // three octets
            *(result++) = static_cast<uint8_t>((cp >> 12)           | 0xe0);
            *(result++) = static_cast<uint8_t>(((cp >> 6) & 0x3f)   | 0x80);
            *(result++) = static_cast<uint8_t>((cp & 0x3f)          | 0x80);
        }
        else {                                // four octets
            *(result++) = static_cast<uint8_t>((cp >> 18)           | 0xf0);
            *(result++) = static_cast<uint8_t>(((cp >> 12) & 0x3f)  | 0x80);
            *(result++) = static_cast<uint8_t>(((cp >> 6) & 0x3f)   | 0x80);
            *(result++) = static_cast<uint8_t>((cp & 0x3f)          | 0x80);
        }
        return result;
    }